

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int internal_path_submit(CManager_conflict cm,int local_path_id,event_item *event)

{
  int iVar1;
  undefined4 in_ESI;
  CManager in_RDI;
  CManager_conflict unaff_retaddr;
  event_item *event_to_submit;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = CManager_locked(in_RDI);
  if (iVar1 != 0) {
    enqueue_event(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                  (event_item *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    return 1;
  }
  __assert_fail("CManager_locked(cm)",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                ,0x604,"int internal_path_submit(CManager, int, event_item *)");
}

Assistant:

int
internal_path_submit(CManager cm, int local_path_id, event_item *event)
{
    event_item *event_to_submit = event;

    assert(CManager_locked(cm));
    enqueue_event(cm, local_path_id, event_to_submit);
    return 1;
}